

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

BuiltinFuncGroup * __thiscall
vkt::sr::anon_unknown_0::BuiltinFuncGroup::operator<<(BuiltinFuncGroup *this,BuiltinFuncInfo *info)

{
  pointer *ppBVar1;
  pointer this_00;
  ulong uVar2;
  pointer pBVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  undefined8 *puVar10;
  pointer pBVar11;
  _Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
  *this_01;
  pointer pBVar12;
  byte bVar13;
  
  bVar13 = 0;
  pBVar9 = (this->funcInfos).
           super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pBVar9 == (this->funcInfos).
                super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (this->funcInfos).
              super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)pBVar9 - (long)this_00;
    if (lVar4 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar2 = lVar4 / 0x78;
    uVar5 = 1;
    if (pBVar9 != this_00) {
      uVar5 = uVar2;
    }
    this_01 = (_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
               *)(uVar5 + uVar2);
    if ((_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
         *)0x111111111111110 < this_01) {
      this_01 = (_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                 *)0x111111111111111;
    }
    if (CARRY8(uVar5,uVar2)) {
      this_01 = (_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                 *)0x111111111111111;
    }
    pBVar3 = std::
             _Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
             ::_M_allocate(this_01,(size_t)this_00);
    puVar10 = (undefined8 *)(lVar4 + (long)pBVar3);
    for (lVar6 = 0xf; pBVar7 = this_00, pBVar11 = pBVar3, lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar10 = info->caseName;
      info = (BuiltinFuncInfo *)((long)info + (ulong)bVar13 * -0x10 + 8);
      puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
    }
    for (; pBVar12 = pBVar11 + 1, lVar4 = 0xf, pBVar8 = pBVar7, pBVar7 != pBVar9;
        pBVar7 = pBVar7 + 1) {
      for (; lVar4 != 0; lVar4 = lVar4 + -1) {
        pBVar11->caseName =
             (char *)(((_Vector_impl *)&pBVar8->caseName)->super__Vector_impl_data)._M_start;
        pBVar8 = (pointer)((long)pBVar8 + (ulong)bVar13 * -0x10 + 8);
        pBVar11 = (pointer)((long)pBVar11 + (ulong)bVar13 * -0x10 + 8);
      }
      pBVar11 = pBVar12;
    }
    lVar4 = (long)(this->funcInfos).
                  super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
    std::
    _Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ::_M_deallocate((_Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
                     *)this_00,(pointer)(lVar4 / 0x78),lVar4 % 0x78);
    (this->funcInfos).
    super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = pBVar3;
    (this->funcInfos).
    super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar12;
    (this->funcInfos).
    super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar3 + (long)this_01;
  }
  else {
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      pBVar9->caseName = (char *)info->caseName;
      info = (BuiltinFuncInfo *)&info->shaderFuncName;
      pBVar9 = (pointer)&pBVar9->shaderFuncName;
    }
    ppBVar1 = &(this->funcInfos).
               super__Vector_base<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo,_std::allocator<vkt::sr::(anonymous_namespace)::BuiltinFuncInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppBVar1 = *ppBVar1 + 1;
  }
  return this;
}

Assistant:

BuiltinFuncGroup&	operator<<			(const BuiltinFuncInfo& info) { funcInfos.push_back(info); return *this; }